

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ForEachSection<bloaty::wasm::ParseSections(bloaty::RangeSink*)::__0>
               (string_view file,anon_class_8_1_89918b91 *section_func)

{
  bool bVar1;
  Section section;
  string_view data;
  string_view *in_stack_000000e8;
  string_view *in_stack_ffffffffffffff88;
  Section *in_stack_ffffffffffffff98;
  anon_class_8_1_89918b91 *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  ReadMagic(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Section::Read(in_stack_000000e8);
    ParseSections::anon_class_8_1_89918b91::operator()
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Section::~Section((Section *)0x1caa79);
  }
  return;
}

Assistant:

void ForEachSection(string_view file, Func&& section_func) {
  string_view data = file;
  ReadMagic(&data);

  while (!data.empty()) {
    Section section = Section::Read(&data);
    section_func(section);
  }
}